

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall
kj::_::BTreeImpl::rotateRight
          (BTreeImpl *this,Leaf *left,Leaf *right,Parent *parent,uint indexInParent)

{
  bool bVar1;
  uint uVar2;
  uint back;
  size_t mid;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  Fault local_38;
  Fault f;
  DebugExpression<bool> _kjCondition;
  uint indexInParent_local;
  Parent *parent_local;
  Leaf *right_local;
  Leaf *left_local;
  BTreeImpl *this_local;
  
  f.exception._4_4_ = indexInParent;
  f.exception._2_1_ = Leaf::isHalfFull(right);
  f.exception._3_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f.exception + 2));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 3));
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x2de,FAILED,"right.isHalfFull()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f.exception + 3));
    Debug::Fault::fatal(&local_38);
  }
  f_1.exception._2_1_ = Leaf::isMostlyFull(left);
  f_1.exception._3_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 2));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f_1.exception + 3));
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&mid,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x2df,FAILED,"left.isMostlyFull()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f_1.exception + 3));
    Debug::Fault::fatal((Fault *)&mid);
  }
  amove<kj::_::BTreeImpl::MaybeUint>(right->rows + 1,right->rows,7);
  uVar2 = Leaf::size(left);
  right->rows[0].i = left->rows[uVar2 - 1].i;
  parent->keys[f.exception._4_4_].i = left->rows[uVar2 - 2].i;
  MaybeUint::operator=(left->rows + (uVar2 - 1),(void *)0x0);
  return;
}

Assistant:

void BTreeImpl::rotateRight(Leaf& left, Leaf& right, Parent& parent, uint indexInParent) {
  // Steal one item from the left node and move it to the right node.

  // Like mergeFrom(), this is only called on an exactly-half-empty node.
  KJ_DASSERT(right.isHalfFull());
  KJ_DASSERT(left.isMostlyFull());

  constexpr size_t mid = Leaf::NROWS/2;
  amove(right.rows + 1, right.rows, mid);

  uint back = left.size() - 1;

  right.rows[0] = left.rows[back];
  parent.keys[indexInParent] = left.rows[back - 1];
  left.rows[back] = nullptr;
}